

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

uint __thiscall ADE_DEP_DPFSP::valutaIndividuo(ADE_DEP_DPFSP *this,Permutazione *p)

{
  uint uVar1;
  uint uVar2;
  type puVar3;
  uint *puVar4;
  type __b;
  ushort local_36;
  unsigned_short j;
  ushort local_28;
  short local_26;
  uint local_24;
  unsigned_short k;
  short c;
  uint Cmax;
  __array Cm;
  Permutazione *p_local;
  ADE_DEP_DPFSP *this_local;
  
  Cm._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)p;
  std::make_unique<unsigned_int[]>((size_t)&k);
  local_24 = 0;
  local_26 = 0;
  for (local_28 = 0;
      (int)(uint)local_28 <
      (int)((uint)(this->istanza).lavori + (uint)(this->istanza).fabbriche + -1);
      local_28 = local_28 + 1) {
    if (*(ushort *)
         (*(long *)((long)Cm._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 8) +
         (ulong)local_28 * 2) < (this->istanza).lavori) {
      for (local_36 = 0; local_36 < (this->istanza).macchine; local_36 = local_36 + 1) {
        if ((local_26 == 0) && (local_36 == 0)) {
          uVar1 = *(this->istanza).p
                   [*(ushort *)
                     (*(long *)((long)Cm._M_t.
                                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                      .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 8
                               ) + (ulong)local_28 * 2)];
          puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k
                              ,0);
          *puVar3 = uVar1;
        }
        else if ((local_26 == 0) || (local_36 == 0)) {
          if ((local_26 == 0) && (local_36 != 0)) {
            uVar1 = (this->istanza).p
                    [*(ushort *)
                      (*(long *)((long)Cm._M_t.
                                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                       .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                                8) + (ulong)local_28 * 2)][local_36];
            puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                                &k,(ulong)local_36 - 1);
            uVar2 = *puVar3;
            puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                                &k,(ulong)local_36);
            *puVar3 = uVar1 + uVar2;
          }
          else {
            uVar1 = *(this->istanza).p
                     [*(ushort *)
                       (*(long *)((long)Cm._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                                 8) + (ulong)local_28 * 2)];
            puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                                &k,0);
            uVar2 = *puVar3;
            puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                     operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                                &k,0);
            *puVar3 = uVar1 + uVar2;
          }
        }
        else {
          uVar1 = (this->istanza).p
                  [*(ushort *)
                    (*(long *)((long)Cm._M_t.
                                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                     .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 8)
                    + (ulong)local_28 * 2)][local_36];
          puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k
                              ,(ulong)local_36 - 1);
          __b = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                          ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k,
                           (ulong)local_36);
          puVar4 = std::max<unsigned_int>(puVar3,__b);
          uVar2 = *puVar4;
          puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k
                              ,(ulong)local_36);
          *puVar3 = uVar1 + uVar2;
        }
      }
    }
    else {
      puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                         ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k,
                          (ulong)(this->istanza).macchine - 1);
      puVar4 = std::max<unsigned_int>(&local_24,puVar3);
      local_24 = *puVar4;
      local_26 = -1;
    }
    local_26 = local_26 + 1;
  }
  puVar3 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                     ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k,
                      (ulong)(this->istanza).macchine - 1);
  puVar4 = std::max<unsigned_int>(&local_24,puVar3);
  uVar1 = *puVar4;
  std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&k);
  return uVar1;
}

Assistant:

unsigned int ADE_DEP_DPFSP::valutaIndividuo(Permutazione* p) {

	auto Cm = make_unique<unsigned int[]>(istanza.macchine);

	unsigned int Cmax = 0;
	short c = 0;

	for (unsigned short k = 0; k < istanza.lavori + istanza.fabbriche - 1; k++, c++) {

		if (p->individuo[k] >= istanza.lavori) {
			Cmax = max(Cmax, Cm[istanza.macchine - 1]);
			c = -1;
		}
		else {
			for (unsigned short j = 0; j < istanza.macchine; j++) {

				if (c == 0 && j == 0) {
					Cm[j] = istanza.p[p->individuo[k]][0];
				}
				else if (c != 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + max(Cm[j - 1], Cm[j]);
				}
				else if (c == 0 && j != 0) {
					Cm[j] = istanza.p[p->individuo[k]][j] + Cm[j - 1];
				}
				else {
					Cm[0] = istanza.p[p->individuo[k]][0] + Cm[0];
				}
			}
		}
	}

	return max(Cmax, Cm[istanza.macchine - 1]);
}